

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_mem.c
# Opt level: O2

TRef lj_opt_dse_ahstore(jit_State *J)

{
  IROp1 *pIVar1;
  ushort uVar2;
  IRRef1 IVar3;
  ushort uVar4;
  AliasRet AVar5;
  TRef TVar6;
  IRIns *pIVar7;
  IRIns *pIVar8;
  IRRef1 *pIVar9;
  
  uVar2 = (J->fold).ins.field_0.op1;
  IVar3 = (J->fold).ins.field_0.op2;
  pIVar7 = (J->cur).ir;
  pIVar9 = J->chain + (J->fold).ins.field_1.o;
  while( true ) {
    uVar4 = *pIVar9;
    if (uVar4 <= uVar2) break;
    pIVar8 = pIVar7 + uVar4;
    AVar5 = aa_ahref(J,pIVar7 + uVar2,pIVar7 + (pIVar8->field_0).op1);
    if (AVar5 == ALIAS_MAY) {
      if ((pIVar8->field_0).op2 != IVar3) break;
    }
    else if (AVar5 == ALIAS_MUST) {
      if ((pIVar8->field_0).op2 == IVar3) {
        return 4;
      }
      if (J->chain[0x11] < uVar4) {
        pIVar7 = pIVar7 + ((J->cur).nins - 1);
        goto LAB_0011a8dd;
      }
      break;
    }
    pIVar9 = &(pIVar8->field_0).prev;
  }
LAB_0011a90c:
  TVar6 = lj_ir_emit(J);
  return TVar6;
LAB_0011a8dd:
  if (pIVar7 <= pIVar8) {
    *pIVar9 = (pIVar8->field_0).prev;
    *pIVar8 = (IRIns)0xc0000000000;
    goto LAB_0011a90c;
  }
  if (((char)(pIVar7->field_1).t.irt < '\0') ||
     (pIVar1 = &(pIVar7->field_1).o, pIVar7 = pIVar7 + -1, *pIVar1 == 'I')) goto LAB_0011a90c;
  goto LAB_0011a8dd;
}

Assistant:

TRef LJ_FASTCALL lj_opt_dse_ahstore(jit_State *J)
{
  IRRef xref = fins->op1;  /* xREF reference. */
  IRRef val = fins->op2;  /* Stored value reference. */
  IRIns *xr = IR(xref);
  IRRef1 *refp = &J->chain[fins->o];
  IRRef ref = *refp;
  while (ref > xref) {  /* Search for redundant or conflicting stores. */
    IRIns *store = IR(ref);
    switch (aa_ahref(J, xr, IR(store->op1))) {
    case ALIAS_NO:
      break;  /* Continue searching. */
    case ALIAS_MAY:	/* Store to MAYBE the same location. */
      if (store->op2 != val)  /* Conflict if the value is different. */
	goto doemit;
      break;  /* Otherwise continue searching. */
    case ALIAS_MUST:	/* Store to the same location. */
      if (store->op2 == val)  /* Same value: drop the new store. */
	return DROPFOLD;
      /* Different value: try to eliminate the redundant store. */
      if (ref > J->chain[IR_LOOP]) {  /* Quick check to avoid crossing LOOP. */
	IRIns *ir;
	/* Check for any intervening guards (includes conflicting loads).
	** Note that lj_tab_keyindex and lj_vm_next don't need guards,
	** since they are followed by at least one guarded VLOAD.
	*/
	for (ir = IR(J->cur.nins-1); ir > store; ir--)
	  if (irt_isguard(ir->t) || ir->o == IR_ALEN)
	    goto doemit;  /* No elimination possible. */
	/* Remove redundant store from chain and replace with NOP. */
	*refp = store->prev;
	lj_ir_nop(store);
	/* Now emit the new store instead. */
      }
      goto doemit;
    }
    ref = *(refp = &store->prev);
  }
doemit:
  return EMITFOLD;  /* Otherwise we have a conflict or simply no match. */
}